

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
::destroy_slots(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                *this)

{
  size_t capacity;
  size_t i;
  size_t sVar1;
  long lVar2;
  Layout LVar3;
  
  capacity = this->capacity_;
  if (capacity != 0) {
    lVar2 = 0x10;
    for (sVar1 = 0; sVar1 != capacity; sVar1 = sVar1 + 1) {
      if (-1 < this->ctrl_[sVar1]) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)this->slots_ + lVar2));
        capacity = this->capacity_;
      }
      lVar2 = lVar2 + 0x18;
    }
    LVar3 = MakeLayout(capacity);
    Deallocate<8ul,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
              ((allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_> *)
               &this->settings_,this->ctrl_,
               LVar3.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<unsigned_long,_std::shared_ptr<ThreadState>_>_>
               .size_[1] * 0x18 +
               (LVar3.
                super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<unsigned_long,_std::shared_ptr<ThreadState>_>_>
                .size_[0] + 7 & 0xfffffffffffffff8));
    this->ctrl_ = EmptyGroup()::empty_group;
    (this->settings_).
    super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>,_0UL,_false>
    .value = 0;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
  }
  return;
}

Assistant:

void destroy_slots() {
        if (!capacity_) return;
        for (size_t i = 0; i != capacity_; ++i) {
            if (IsFull(ctrl_[i])) {
                PolicyTraits::destroy(&alloc_ref(), slots_ + i);
            }
        }
        auto layout = MakeLayout(capacity_);
        // Unpoison before returning the memory to the allocator.
        SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
        Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
        ctrl_ = EmptyGroup();
        slots_ = nullptr;
        size_ = 0;
        capacity_ = 0;
        growth_left() = 0;
    }